

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::CodeGeneratorResponse_File::Clear(CodeGeneratorResponse_File *this)

{
  uint uVar1;
  LogMessage *pLVar2;
  string *psVar3;
  LogFinisher local_49;
  LogMessage local_48;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 7) != 0) {
    if ((uVar1 & 1) != 0) {
      psVar3 = (this->name_).ptr_;
      if (psVar3 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::LogMessage::LogMessage
                  (&local_48,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/plugin.pb.cc"
                   ,0x59a);
        pLVar2 = internal::LogMessage::operator<<
                           (&local_48,
                            "CHECK failed: !name_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        internal::LogFinisher::operator=(&local_49,pLVar2);
        internal::LogMessage::~LogMessage(&local_48);
        psVar3 = (this->name_).ptr_;
      }
      psVar3->_M_string_length = 0;
      *(psVar3->_M_dataplus)._M_p = '\0';
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 & 2) != 0) {
      psVar3 = (this->insertion_point_).ptr_;
      if (psVar3 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::LogMessage::LogMessage
                  (&local_48,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/plugin.pb.cc"
                   ,0x59e);
        pLVar2 = internal::LogMessage::operator<<
                           (&local_48,
                            "CHECK failed: !insertion_point_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        internal::LogFinisher::operator=(&local_49,pLVar2);
        internal::LogMessage::~LogMessage(&local_48);
        psVar3 = (this->insertion_point_).ptr_;
      }
      psVar3->_M_string_length = 0;
      *(psVar3->_M_dataplus)._M_p = '\0';
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 & 4) != 0) {
      psVar3 = (this->content_).ptr_;
      if (psVar3 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::LogMessage::LogMessage
                  (&local_48,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/plugin.pb.cc"
                   ,0x5a2);
        pLVar2 = internal::LogMessage::operator<<
                           (&local_48,
                            "CHECK failed: !content_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        internal::LogFinisher::operator=(&local_49,pLVar2);
        internal::LogMessage::~LogMessage(&local_48);
        psVar3 = (this->content_).ptr_;
      }
      psVar3->_M_string_length = 0;
      *(psVar3->_M_dataplus)._M_p = '\0';
    }
  }
  (this->_has_bits_).has_bits_[0] = 0;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) != 0) {
    internal::InternalMetadataWithArena::DoClear(&this->_internal_metadata_);
  }
  return;
}

Assistant:

void CodeGeneratorResponse_File::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.compiler.CodeGeneratorResponse.File)
  if (_has_bits_[0 / 32] & 7u) {
    if (has_name()) {
      GOOGLE_DCHECK(!name_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*name_.UnsafeRawStringPointer())->clear();
    }
    if (has_insertion_point()) {
      GOOGLE_DCHECK(!insertion_point_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*insertion_point_.UnsafeRawStringPointer())->clear();
    }
    if (has_content()) {
      GOOGLE_DCHECK(!content_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*content_.UnsafeRawStringPointer())->clear();
    }
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}